

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_convex_poly.cpp
# Opt level: O2

ON_3dVector * __thiscall
ON_ConvexHullRef::Vertex(ON_3dVector *__return_storage_ptr__,ON_ConvexHullRef *this,int j)

{
  double *pdVar1;
  double dVar2;
  double yy;
  double zz;
  long lVar3;
  ON_4dPoint hv;
  ON_4dPoint local_38;
  
  if (this->m_is_rat == true) {
    lVar3 = (long)j * (long)this->m_stride;
    pdVar1 = this->m_v + lVar3;
    local_38.x = *pdVar1;
    local_38.y = pdVar1[1];
    pdVar1 = this->m_v + lVar3 + 2;
    local_38.z = *pdVar1;
    local_38.w = pdVar1[1];
    dVar2 = ON_4dPoint::EuclideanX(&local_38);
    yy = ON_4dPoint::EuclideanY(&local_38);
    zz = ON_4dPoint::EuclideanZ(&local_38);
    ON_3dVector::ON_3dVector(__return_storage_ptr__,dVar2,yy,zz);
  }
  else {
    pdVar1 = this->m_v;
    lVar3 = (long)j * (long)this->m_stride;
    __return_storage_ptr__->z = pdVar1[lVar3 + 2];
    pdVar1 = pdVar1 + lVar3;
    dVar2 = pdVar1[1];
    __return_storage_ptr__->x = *pdVar1;
    __return_storage_ptr__->y = dVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_ConvexHullRef::Vertex(int j) const
{
  ON_3dVector v;
  if (m_is_rat)
  {
    ON_4dPoint hv = *(reinterpret_cast<const ON_4dPoint*>(m_v + m_stride*j));
    v = ON_3dVector(hv.EuclideanX(), hv.EuclideanY(), hv.EuclideanZ());
  }
  else
  {
    v = *(reinterpret_cast<const ON_3dVector*>(m_v + m_stride*j));
  }
  return v;
}